

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O0

void __thiscall adios2::format::BP5Serializer::InitStep(BP5Serializer *this,BufferV *DataBuffer)

{
  undefined8 in_RSI;
  long in_RDI;
  allocator local_b9;
  string local_b8 [28];
  int in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  undefined8 local_10;
  
  local_10 = in_RSI;
  if (*(long *)(in_RDI + 0x128) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Toolkit",&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"format::BP5Serializer",&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff70,"InitStep",(allocator *)&stack0xffffffffffffff6f);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"without prior Close",&local_b9);
    helper::Throw<std::logic_error>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  *(undefined8 *)(in_RDI + 0x128) = local_10;
  *(undefined8 *)(in_RDI + 0x148) = 0;
  return;
}

Assistant:

void BP5Serializer::InitStep(BufferV *DataBuffer)
{
    if (CurDataBuffer != NULL)
    {
        helper::Throw<std::logic_error>("Toolkit", "format::BP5Serializer", "InitStep",
                                        "without prior Close");
    }
    CurDataBuffer = DataBuffer;
    m_PriorDataBufferSizeTotal = 0;
}